

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O2

Var Js::JavascriptOperators::NewJavascriptArrayNoArg(ScriptContext *requestContext)

{
  bool bVar1;
  ThreadContext *pTVar2;
  bool bVar3;
  JavascriptArray *obj;
  
  pTVar2 = requestContext->threadContext;
  bVar1 = pTVar2->noJsReentrancy;
  pTVar2->noJsReentrancy = true;
  obj = JavascriptLibrary::CreateArray((requestContext->super_ScriptContextBase).javascriptLibrary);
  bVar3 = ConfigFlagsTable::IsEnabled((ConfigFlagsTable *)&Configuration::Global,autoProxyFlag);
  if (bVar3) {
    obj = (JavascriptArray *)JavascriptProxy::AutoProxyWrapper(obj);
  }
  pTVar2->noJsReentrancy = bVar1;
  return obj;
}

Assistant:

Var JavascriptOperators::NewJavascriptArrayNoArg(ScriptContext* requestContext)
    {
        JIT_HELPER_NOT_REENTRANT_HEADER(NewJavascriptArrayNoArg, reentrancylock, requestContext->GetThreadContext());
        JavascriptArray * newArray = requestContext->GetLibrary()->CreateArray();
        JS_ETW(EventWriteJSCRIPT_RECYCLER_ALLOCATE_OBJECT(newArray));
#if ENABLE_DEBUG_CONFIG_OPTIONS
        if (Js::Configuration::Global.flags.IsEnabled(Js::autoProxyFlag))
        {
            newArray = static_cast<JavascriptArray*>(JavascriptProxy::AutoProxyWrapper(newArray));
        }
#endif
        return newArray;
        JIT_HELPER_END(NewJavascriptArrayNoArg);
    }